

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

void __thiscall Bstrlib::CBString::CBString(CBString *this,tagbstring *x)

{
  int iVar1;
  uchar *__dest;
  CBStringException *this_00;
  size_t __n;
  CBStringException bstr__cppwrapper_exception;
  string local_68;
  CBStringException local_48;
  
  this->_vptr_CBString = (_func_int **)&PTR__CBString_00184860;
  iVar1 = x->slen;
  __n = (size_t)iVar1;
  (this->super_tagbstring).slen = iVar1;
  (this->super_tagbstring).mlen = iVar1 + 1U;
  (this->super_tagbstring).data = (uchar *)0x0;
  if ((-1 < (long)__n) && (x->data != (uchar *)0x0)) {
    __dest = (uchar *)malloc((ulong)(iVar1 + 1U));
    (this->super_tagbstring).data = __dest;
    if (__dest != (uchar *)0x0) {
      memcpy(__dest,x->data,__n);
      __dest[__n] = '\0';
      return;
    }
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"CBString::Failure in (tagbstring) constructor","");
  CBStringException::CBStringException(&local_48,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(this_00,&local_48);
  __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

CBString::CBString (const tagbstring& x) {
	slen = x.slen;
	mlen = slen + 1;
	data = NULL;
	if (slen >= 0 && x.data != NULL) data = (unsigned char *) bstr__alloc (mlen);
	if (!data) {
		bstringThrow ("Failure in (tagbstring) constructor");
	} else {
		bstr__memcpy (data, x.data, slen);
		data[slen] = '\0';
	}
}